

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O1

CommandOptions * write_PCM_file(CommandOptions *Options)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  FILE *pFVar7;
  int iVar8;
  Rational *this;
  long lVar9;
  char *pcVar10;
  AESEncContext *this_00;
  HMACContext *this_01;
  uint uVar11;
  long *plVar12;
  long in_RSI;
  MyInfo *pMVar13;
  byte bVar14;
  double dVar15;
  FortunaRNG RNG;
  MXFWriter Writer;
  char buf [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  long local_2a0 [2];
  undefined4 local_290;
  AudioDescriptor ADesc;
  Result_t result;
  byte_t IV_buf [16];
  long local_198 [3];
  FrameBuffer FrameBuffer;
  PCMParserList Parser;
  Result_t local_100 [104];
  AudioDescriptor local_98 [2];
  
  bVar14 = 0;
  ASDCP::PCMParserList::PCMParserList(&Parser);
  AS_02::PCM::MXFWriter::MXFWriter(&Writer);
  ASDCP::FrameBuffer::FrameBuffer(&FrameBuffer.super_FrameBuffer);
  FrameBuffer._0_8_ = &PTR__FrameBuffer_0011ab50;
  ASDCP::PCMParserList::OpenRead((list *)&result,(Rational *)&Parser);
  if (_result < 0) {
    this = (Rational *)0x0;
  }
  else {
    ADesc.EditRate.Numerator = 0;
    ADesc.EditRate.Denominator = 0;
    ADesc.AudioSamplingRate.Numerator = 0;
    ADesc.AudioSamplingRate.Denominator = 0;
    ASDCP::PCMParserList::FillAudioDescriptor(local_98);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    ADesc.EditRate = *(Rational *)(in_RSI + 0x18);
    ceil(((double)ADesc.AudioSamplingRate.Numerator / (double)ADesc.AudioSamplingRate.Denominator) /
         ((double)ADesc.EditRate.Numerator / (double)ADesc.EditRate.Denominator));
    ASDCP::FrameBuffer::Capacity((uint)local_100);
    Kumu::Result_t::~Result_t(local_100);
    pFVar7 = _stderr;
    if (*(char *)(in_RSI + 5) == '\x01') {
      dVar15 = (double)ADesc.AudioSamplingRate.Numerator;
      dVar2 = (double)ADesc.AudioSamplingRate.Denominator;
      snprintf(buf,0x40,"%d/%d",(ulong)*(uint *)(in_RSI + 0x18),(ulong)*(uint *)(in_RSI + 0x1c));
      dVar3 = ceil(((double)ADesc.AudioSamplingRate.Numerator /
                   (double)ADesc.AudioSamplingRate.Denominator) /
                   ((double)ADesc.EditRate.Numerator / (double)ADesc.EditRate.Denominator));
      fprintf(pFVar7,"%.1fkHz PCM Audio, %s fps (%u spf)\n",SUB84((dVar15 / dVar2) / 1000.0,0),buf,
              (long)dVar3);
      fputs("AudioDescriptor:\n",_stderr);
      ASDCP::PCM::AudioDescriptorDump(&ADesc,(_IO_FILE *)0x0);
    }
    this = (Rational *)operator_new(0x1e8);
    ASDCP::MXF::WaveAudioDescriptor::WaveAudioDescriptor((WaveAudioDescriptor *)this,g_dict);
    ASDCP::PCM_ADesc_to_MD((AudioDescriptor *)buf,(WaveAudioDescriptor *)&ADesc);
    Kumu::Result_t::operator=(&result,(Result_t *)buf);
    Kumu::Result_t::~Result_t((Result_t *)buf);
    plVar1 = (long *)(in_RSI + 0x110);
    if (*(long **)(in_RSI + 0x110) == plVar1) {
      *(undefined1 *)&this[0x39].Numerator = *(undefined1 *)(in_RSI + 0x78);
      uVar4 = *(undefined4 *)(in_RSI + 0x7d);
      uVar5 = *(undefined4 *)(in_RSI + 0x81);
      uVar6 = *(undefined4 *)(in_RSI + 0x85);
      *(undefined4 *)((long)&this[0x39].Numerator + 1) = *(undefined4 *)(in_RSI + 0x79);
      *(undefined4 *)((long)&this[0x39].Denominator + 1) = uVar4;
      *(undefined4 *)((long)&this[0x3a].Numerator + 1) = uVar5;
      *(undefined4 *)((long)&this[0x3a].Denominator + 1) = uVar6;
      *(undefined1 *)&this[0x3c].Numerator = 1;
    }
    else {
      iVar8 = ASDCP::MXF::ASDCP_MCAConfigParser::ChannelCount();
      pFVar7 = _stderr;
      if (iVar8 != this[0x2d].Numerator) {
        uVar11 = ASDCP::MXF::ASDCP_MCAConfigParser::ChannelCount();
        fprintf(pFVar7,"MCA label count (%d) differs from essence stream channel count (%d).\n",
                (ulong)uVar11,(ulong)(uint)this[0x2d].Numerator);
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
        goto LAB_0010e019;
      }
      plVar12 = (long *)*plVar1;
      if (plVar12 != plVar1) {
        do {
          if (plVar12[2] == 0) {
            lVar9 = 0;
          }
          else {
            lVar9 = __dynamic_cast(plVar12[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                                   &ASDCP::MXF::SoundfieldGroupLabelSubDescriptor::typeinfo,0);
          }
          if (lVar9 != 0) {
            if (*(long *)(in_RSI + 0x2d0) != 0) {
              ASDCP::MXF::UTF16String::UTF16String((UTF16String *)buf,(string *)(in_RSI + 0x2c8));
              std::__cxx11::string::_M_assign((string *)(lVar9 + 0x298));
              *(undefined1 *)(lVar9 + 0x2b8) = 1;
              if ((char *)buf._8_8_ != buf + 0x18) {
                operator_delete((void *)buf._8_8_,buf._24_8_ + 1);
              }
            }
            if (*(long *)(in_RSI + 0x2b0) != 0) {
              ASDCP::MXF::UTF16String::UTF16String((UTF16String *)buf,(string *)(in_RSI + 0x2a8));
              std::__cxx11::string::_M_assign((string *)(lVar9 + 0x2c8));
              *(undefined1 *)(lVar9 + 0x2e8) = 1;
              if ((char *)buf._8_8_ != buf + 0x18) {
                operator_delete((void *)buf._8_8_,buf._24_8_ + 1);
              }
            }
          }
          plVar12 = (long *)*plVar12;
        } while (plVar12 != plVar1);
      }
      pcVar10 = (char *)ASDCP::Dictionary::Type((MDD_t)g_dict);
      buf._0_8_ = *(undefined8 *)pcVar10;
      buf._8_8_ = *(undefined8 *)(pcVar10 + 8);
      *(undefined1 *)&this[0x39].Numerator = 1;
      *(undefined4 *)((long)&this[0x39].Numerator + 1) = buf._0_4_;
      *(undefined4 *)((long)&this[0x39].Denominator + 1) = buf._4_4_;
      *(undefined4 *)((long)&this[0x3a].Numerator + 1) = buf._8_4_;
      *(undefined4 *)((long)&this[0x3a].Denominator + 1) = buf._12_4_;
      *(undefined1 *)&this[0x3c].Numerator = 1;
    }
  }
  if ((-1 < _result) && (*(char *)(in_RSI + 0xc) == '\0')) {
    pMVar13 = &s_MyInfo;
    pcVar10 = buf;
    for (lVar9 = 8; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)pcVar10 = *(undefined8 *)(pMVar13->super_WriterInfo).ProductUUID;
      pMVar13 = (MyInfo *)((long)pMVar13 + ((ulong)bVar14 * -2 + 1) * 8);
      pcVar10 = pcVar10 + (ulong)bVar14 * -0x10 + 8;
    }
    local_2f0._M_allocated_capacity = (size_type)local_2e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f0,s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductVersion._M_string_length);
    local_2d0._M_allocated_capacity = (size_type)local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d0,s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.CompanyName._M_string_length);
    local_2b0._M_allocated_capacity = (size_type)local_2a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductName._M_string_length);
    local_290 = 2;
    if (*(char *)(in_RSI + 2) == '\x01') {
      buf._16_8_ = *(undefined8 *)(in_RSI + 0x45);
      buf._24_8_ = *(undefined8 *)(in_RSI + 0x4d);
    }
    else {
      Kumu::GenRandomUUID((uchar *)(buf + 0x10));
    }
    if (*(char *)(in_RSI + 1) == '\x01') {
      Kumu::FortunaRNG::FortunaRNG(&RNG);
      Kumu::GenRandomUUID((uchar *)(buf + 0x20));
      if (*(char *)(in_RSI + 0x34) == '\x01') {
        buf._48_4_ = *(undefined4 *)(in_RSI + 0x35);
        buf._52_4_ = *(undefined4 *)(in_RSI + 0x39);
        buf._56_4_ = *(undefined4 *)(in_RSI + 0x3d);
        buf._60_4_ = *(undefined4 *)(in_RSI + 0x41);
      }
      else {
        ADesc.AudioSamplingRate.Numerator = 0;
        ADesc.AudioSamplingRate.Denominator = 0;
        ADesc.Locked._0_1_ = '\0';
        ADesc._17_4_ = 0;
        ADesc._21_4_ = 0;
        ADesc.EditRate = (Rational)&PTR__IArchive_0011aa68;
        Kumu::GenRandomValue((UUID *)&ADesc);
        buf[0x33] = (char)ADesc.AudioSamplingRate.Denominator;
        buf._48_3_ = ADesc.AudioSamplingRate.Numerator._1_3_;
        buf[0x37] = (char)ADesc.Locked;
        buf._52_3_ = ADesc.AudioSamplingRate.Denominator._1_3_;
        buf._56_4_ = ADesc._17_4_;
        buf._60_4_ = ADesc._21_4_;
      }
      this_00 = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(this_00);
      ASDCP::AESEncContext::InitKey((uchar *)&ADesc);
      Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
      Kumu::Result_t::~Result_t((Result_t *)&ADesc);
      if (-1 < _result) {
        Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
        ASDCP::AESEncContext::SetIVec((uchar *)&ADesc);
        Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
        Kumu::Result_t::~Result_t((Result_t *)&ADesc);
      }
      if ((-1 < _result) && (*(char *)(in_RSI + 4) == '\x01')) {
        this_01 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_01);
        ASDCP::HMACContext::InitKey((uchar *)&ADesc,(LabelSet_t)this_01);
        Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
        Kumu::Result_t::~Result_t((Result_t *)&ADesc);
      }
      Kumu::FortunaRNG::~FortunaRNG(&RNG);
    }
    if (-1 < _result) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)IV_buf,*(char **)(in_RSI + 0x268),(allocator<char> *)&RNG);
      AS_02::PCM::MXFWriter::OpenWrite
                ((string *)&ADesc,(WriterInfo *)&Writer,(FileDescriptor *)IV_buf,(list *)buf,this,
                 (int)in_RSI + 0x110);
      Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
      Kumu::Result_t::~Result_t((Result_t *)&ADesc);
      if ((long *)IV_buf._0_8_ != local_198) {
        operator_delete((void *)IV_buf._0_8_,local_198[0] + 1);
      }
    }
    if ((long *)local_2b0._M_allocated_capacity != local_2a0) {
      operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0[0] + 1);
    }
    if ((_Alloc_hider *)local_2d0._M_allocated_capacity != local_2c0) {
      operator_delete((void *)local_2d0._M_allocated_capacity,(ulong)(local_2c0[0]._M_p + 1));
    }
    if ((_Alloc_hider *)local_2f0._M_allocated_capacity != local_2e0) {
      operator_delete((void *)local_2f0._M_allocated_capacity,(ulong)(local_2e0[0]._M_p + 1));
    }
  }
  if (-1 < _result) {
    ASDCP::PCMParserList::Reset();
    Kumu::Result_t::operator=(&result,(Result_t *)buf);
    Kumu::Result_t::~Result_t((Result_t *)buf);
    if ((-1 < _result) && (*(int *)(in_RSI + 0x10) != 0)) {
      uVar11 = 0;
      do {
        ASDCP::PCMParserList::ReadFrame((FrameBuffer *)buf);
        Kumu::Result_t::operator=(&result,(Result_t *)buf);
        Kumu::Result_t::~Result_t((Result_t *)buf);
        if (-1 < _result) {
          if (*(char *)(in_RSI + 5) == '\x01') {
            ASDCP::PCM::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
          }
          if (*(char *)(in_RSI + 0xc) == '\0') {
            AS_02::PCM::MXFWriter::WriteFrame
                      ((FrameBuffer *)buf,(AESEncContext *)&Writer,(HMACContext *)&FrameBuffer);
            Kumu::Result_t::operator=(&result,(Result_t *)buf);
            Kumu::Result_t::~Result_t((Result_t *)buf);
          }
        }
      } while ((-1 < _result) && (uVar11 = uVar11 + 1, uVar11 < *(uint *)(in_RSI + 0x10)));
    }
    if (_result == Kumu::RESULT_ENDOFFILE) {
      Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
    }
  }
  if ((-1 < _result) && (*(char *)(in_RSI + 0xc) == '\0')) {
    AS_02::PCM::MXFWriter::Finalize();
    Kumu::Result_t::operator=(&result,(Result_t *)buf);
    Kumu::Result_t::~Result_t((Result_t *)buf);
  }
  Kumu::Result_t::Result_t((Result_t *)Options,&result);
LAB_0010e019:
  Kumu::Result_t::~Result_t(&result);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  AS_02::PCM::MXFWriter::~MXFWriter(&Writer);
  ASDCP::PCMParserList::~PCMParserList(&Parser);
  return Options;
}

Assistant:

Result_t
write_PCM_file(CommandOptions& Options)
{
  AESEncContext*    Context = 0;
  HMACContext*      HMAC = 0;
  PCMParserList     Parser;
  AS_02::PCM::MXFWriter    Writer;
  PCM::FrameBuffer  FrameBuffer;
  ASDCP::MXF::WaveAudioDescriptor *essence_descriptor = 0;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames, Options.edit_rate);

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      ASDCP::PCM::AudioDescriptor ADesc;
      Parser.FillAudioDescriptor(ADesc);

      ADesc.EditRate = Options.edit_rate;
      FrameBuffer.Capacity(PCM::CalcFrameBufferSize(ADesc));

      if ( Options.verbose_flag )
	{
	  char buf[64];
	  fprintf(stderr, "%.1fkHz PCM Audio, %s fps (%u spf)\n",
		  ADesc.AudioSamplingRate.Quotient() / 1000.0,
		  RationalToString(Options.edit_rate, buf, 64),
		  PCM::CalcSamplesPerFrame(ADesc));
	  fputs("AudioDescriptor:\n", stderr);
	  PCM::AudioDescriptorDump(ADesc);
	}

      essence_descriptor = new ASDCP::MXF::WaveAudioDescriptor(g_dict);

      result = ASDCP::PCM_ADesc_to_MD(ADesc, essence_descriptor);

      if ( Options.mca_config.empty() )
	{
	  essence_descriptor->ChannelAssignment = Options.channel_assignment;
	}
      else
	{
	  if ( Options.mca_config.ChannelCount() != essence_descriptor->ChannelCount )
	    {
	      fprintf(stderr, "MCA label count (%d) differs from essence stream channel count (%d).\n",
		      Options.mca_config.ChannelCount(), essence_descriptor->ChannelCount);
	      return RESULT_FAIL;
	    }

	  // This marks all soundfield groups using the same MCA property values
	  MXF::InterchangeObject_list_t::iterator i;
	  for ( i = Options.mca_config.begin(); i != Options.mca_config.end(); ++i )
	    {
	      MXF::SoundfieldGroupLabelSubDescriptor * desc = dynamic_cast<MXF::SoundfieldGroupLabelSubDescriptor*>(*i);
	      if ( desc != 0 )
		{
		  if ( ! Options.mca_audio_content_kind.empty() )
		    {
		      desc->MCAAudioContentKind = Options.mca_audio_content_kind;
		    }
		  if ( ! Options.mca_audio_element_kind.empty() )
		    {
		      desc->MCAAudioElementKind = Options.mca_audio_element_kind;
		    }
		}
	    }

	  essence_descriptor->ChannelAssignment = g_dict->ul(MDD_IMFAudioChannelCfg_MCA);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      Info.LabelSetType = LS_MXF_SMPTE;

      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
      byte_t            IV_buf[CBC_BLOCK_SIZE];
      Kumu::FortunaRNG  RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	{
	  result = Writer.OpenWrite(Options.out_file.c_str(), Info, essence_descriptor,
				    Options.mca_config, Options.edit_rate);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = Parser.Reset();
      ui32_t duration = 0;

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = Parser.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);

	      if ( ! Options.no_write_flag )
		{
		  result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

		  // The Writer class will forward the last block of ciphertext
		  // to the encryption context for use as the IV for the next
		  // frame. If you want to use non-sequitur IV values, un-comment
		  // the following  line of code.
		  // if ( ASDCP_SUCCESS(result) && Options.key_flag )
		  //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
		}
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}